

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::FlushExprTreeStack(WatWriter *this)

{
  pointer pEVar1;
  pointer pEVar2;
  undefined1 local_38 [8];
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  stack_copy;
  
  local_38 = (undefined1  [8])
             (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_start;
  stack_copy.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->expr_tree_stack_).
       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  stack_copy.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->expr_tree_stack_).
       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->expr_tree_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expr_tree_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expr_tree_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar1 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar1 != (pointer)0x0) {
    pEVar2 = (pointer)0x0;
    do {
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector(&pEVar2->children);
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != pEVar1);
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            *)local_38);
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             *)local_38);
  return;
}

Assistant:

void WatWriter::FlushExprTreeStack() {
  std::vector<ExprTree> stack_copy(std::move(expr_tree_stack_));
  expr_tree_stack_.clear();
  FlushExprTreeVector(stack_copy);
}